

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O2

bool pstore::http::details::starts_with(string *s,string *prefix)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = prefix->_M_string_length;
  uVar2 = s->_M_string_length;
  if (uVar1 <= s->_M_string_length) {
    uVar2 = uVar1;
  }
  for (uVar4 = 0;
      (uVar3 = uVar2, uVar2 != uVar4 &&
      (uVar3 = uVar4, (s->_M_dataplus)._M_p[uVar4] == (prefix->_M_dataplus)._M_p[uVar4]));
      uVar4 = uVar4 + 1) {
  }
  return uVar3 == uVar1;
}

Assistant:

inline bool starts_with (std::string const & s, std::string const & prefix) {
                std::string::size_type pos = 0;
                while (pos < s.length () && pos < prefix.length () && s[pos] == prefix[pos]) {
                    ++pos;
                }
                return pos == prefix.length ();
            }